

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContextUtil.cpp
# Opt level: O0

void sglr::drawQuad(Context *ctx,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  bool bVar1;
  ContextType type;
  ApiType requiredApiType;
  ContextType ctxType;
  Vec3 *p1_local;
  Vec3 *p0_local;
  deUint32 program_local;
  Context *ctx_local;
  
  type = Context::getType(ctx);
  bVar1 = glu::isContextTypeGLCore(type);
  if (!bVar1) {
    requiredApiType = glu::ApiType::es(3,1);
    bVar1 = glu::contextSupports(type,requiredApiType);
    if (!bVar1) {
      drawQuadWithClientPointers(ctx,program,p0,p1);
      return;
    }
  }
  drawQuadWithVaoBuffers(ctx,program,p0,p1);
  return;
}

Assistant:

void drawQuad (sglr::Context& ctx, deUint32 program, const tcu::Vec3& p0, const tcu::Vec3& p1)
{
	const glu::ContextType	ctxType	= ctx.getType();

	if (glu::isContextTypeGLCore(ctxType) || (contextSupports(ctxType, glu::ApiType::es(3,1))))
		drawQuadWithVaoBuffers(ctx, program, p0, p1);
	else
	{
		DE_ASSERT(isContextTypeES(ctxType));
		drawQuadWithClientPointers(ctx, program, p0, p1);
	}
}